

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib552.c
# Opt level: O0

size_t read_callback(void *ptr,size_t size,size_t nmemb,void *stream)

{
  size_t local_48;
  size_t given;
  size_t available;
  size_t amount;
  void *stream_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  local_48 = 70000 - current_offset;
  if (nmemb * size < local_48) {
    local_48 = nmemb * size;
  }
  memcpy(ptr,databuf + current_offset,local_48);
  current_offset = local_48 + current_offset;
  return local_48;
}

Assistant:

static size_t read_callback(void *ptr, size_t size, size_t nmemb, void *stream)
{
  size_t  amount = nmemb * size; /* Total bytes curl wants */
  size_t  available = sizeof(databuf) - current_offset; /* What we have to
                                                           give */
  size_t  given = amount < available ? amount : available; /* What is given */
  (void)stream;
  memcpy(ptr, databuf + current_offset, given);
  current_offset += given;
  return given;
}